

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathDebugDumpNode(FILE *output,xmlNodePtr cur,int depth)

{
  undefined1 local_88 [8];
  char shift [100];
  int i;
  int depth_local;
  xmlNodePtr cur_local;
  FILE *output_local;
  
  shift[0x60] = '\0';
  shift[0x61] = '\0';
  shift[0x62] = '\0';
  shift[99] = '\0';
  for (; (int)shift._96_4_ < depth && (int)shift._96_4_ < 0x19; shift._96_4_ = shift._96_4_ + 1) {
    local_88[shift._96_4_ * 2 + 1] = 0x20;
    local_88[(int)(shift._96_4_ << 1)] = 0x20;
  }
  local_88[shift._96_4_ * 2 + 1] = 0;
  local_88[(int)(shift._96_4_ << 1)] = 0;
  if (cur == (xmlNodePtr)0x0) {
    fprintf((FILE *)output,"%s",local_88);
    fprintf((FILE *)output,"Node is NULL !\n");
  }
  else if ((cur->type == XML_DOCUMENT_NODE) || (cur->type == XML_HTML_DOCUMENT_NODE)) {
    fprintf((FILE *)output,"%s",local_88);
    fprintf((FILE *)output," /\n");
  }
  else if (cur->type == XML_ATTRIBUTE_NODE) {
    xmlDebugDumpAttr(output,(xmlAttrPtr)cur,depth);
  }
  else {
    xmlDebugDumpOneNode(output,cur,depth);
  }
  return;
}

Assistant:

static void
xmlXPathDebugDumpNode(FILE *output, xmlNodePtr cur, int depth) {
    int i;
    char shift[100];

    for (i = 0;((i < depth) && (i < 25));i++)
        shift[2 * i] = shift[2 * i + 1] = ' ';
    shift[2 * i] = shift[2 * i + 1] = 0;
    if (cur == NULL) {
	fprintf(output, "%s", shift);
	fprintf(output, "Node is NULL !\n");
	return;

    }

    if ((cur->type == XML_DOCUMENT_NODE) ||
	     (cur->type == XML_HTML_DOCUMENT_NODE)) {
	fprintf(output, "%s", shift);
	fprintf(output, " /\n");
    } else if (cur->type == XML_ATTRIBUTE_NODE)
	xmlDebugDumpAttr(output, (xmlAttrPtr)cur, depth);
    else
	xmlDebugDumpOneNode(output, cur, depth);
}